

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O0

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>
::local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
          (solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>
           *this,bit_array *x,row_value *it,int k,int selected,int r_size,float kappa,float delta)

{
  float fVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  type pfVar4;
  type prVar5;
  type args_3;
  row_value *prVar6;
  float fVar7;
  float repair_3;
  row_value *var_3;
  float repair_2;
  row_value *var_2;
  undefined1 auStack_a8 [4];
  int i_2;
  float local_94;
  row_value *prStack_90;
  float repair_1;
  row_value *var_1;
  undefined1 auStack_80 [4];
  int i_1;
  float local_6c;
  row_value *prStack_68;
  float repair;
  row_value *var;
  undefined1 auStack_58 [4];
  int i;
  float local_48;
  float local_44;
  float d;
  float old_pi;
  float middle;
  float two;
  float one;
  float delta_local;
  float kappa_local;
  int r_size_local;
  int selected_local;
  int k_local;
  row_value *it_local;
  bit_array *x_local;
  solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
  *this_local;
  
  middle = 1.0;
  old_pi = 2.0;
  d = 1.5;
  two = delta;
  one = kappa;
  delta_local = (float)r_size;
  kappa_local = (float)selected;
  r_size_local = k;
  _selected_local = it;
  it_local = (row_value *)x;
  x_local = (bit_array *)this;
  pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                     ((unique_ptr<float[],_std::default_delete<float[]>_> *)(this + 0x78),(long)k);
  local_44 = *pfVar4;
  local_48 = one / (1.0 - one) + two;
  if ((int)kappa_local < 0) {
    prVar5 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                           *)(this + 0x60),0);
    fVar7 = prVar5->value;
    pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       ((unique_ptr<float[],_std::default_delete<float[]>_> *)(this + 0x78),
                        (long)r_size_local);
    *pfVar4 = fVar7 / 2.0 + *pfVar4;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               "    selected: {}/{} ({})/2 = pi {}\n");
    prVar5 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                           *)(this + 0x60),0);
    pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       ((unique_ptr<float[],_std::default_delete<float[]>_> *)(this + 0x78),
                        (long)r_size_local);
    debug_logger<false>::log<int,int,float,float>
              ((debug_logger<false> *)this,_auStack_58,(int *)&kappa_local,(int *)&delta_local,
               &prVar5->value,pfVar4);
    for (var._4_4_ = 0.0; prVar6 = _selected_local, var._4_4_ != delta_local;
        var._4_4_ = (float)((int)var._4_4_ + 1)) {
      prVar5 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                             *)(this + 0x60),(long)(int)var._4_4_);
      prStack_68 = prVar6 + prVar5->id;
      bit_array_impl::unset((bit_array_impl *)it_local,prStack_68->column);
      fVar7 = local_48;
      pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                         ((unique_ptr<float[],_std::default_delete<float[]>_> *)(this + 0x50),
                          (long)prStack_68->value);
      *pfVar4 = *pfVar4 - fVar7;
      local_6c = solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                 ::local_compute_reduced_cost<baryonyx::bit_array>
                           ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                             *)this,prStack_68->column,(bit_array *)it_local);
      if (local_6c <= 0.0) {
        pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           ((unique_ptr<float[],_std::default_delete<float[]>_> *)(this + 0x50),
                            (long)prStack_68->value);
        fVar7 = (*pfVar4 + local_6c) - local_48;
        pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           ((unique_ptr<float[],_std::default_delete<float[]>_> *)(this + 0x50),
                            (long)prStack_68->value);
        *pfVar4 = fVar7;
      }
    }
  }
  else if ((int)kappa_local + 1 < (int)delta_local) {
    prVar5 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                           *)(this + 0x60),(long)(int)kappa_local);
    fVar7 = prVar5->value;
    prVar5 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                           *)(this + 0x60),(long)((int)kappa_local + 1));
    fVar1 = prVar5->value;
    pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       ((unique_ptr<float[],_std::default_delete<float[]>_> *)(this + 0x78),
                        (long)r_size_local);
    *pfVar4 = (fVar7 + fVar1) / 2.0 + *pfVar4;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_a8,
               "    selected: {}/{} ({}x{})/2 = pi {}\n");
    prVar5 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                           *)(this + 0x60),(long)(int)kappa_local);
    args_3 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                           *)(this + 0x60),(long)((int)kappa_local + 1));
    pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       ((unique_ptr<float[],_std::default_delete<float[]>_> *)(this + 0x78),
                        (long)r_size_local);
    debug_logger<false>::log<int,int,float,float,float>
              ((debug_logger<false> *)this,_auStack_a8,(int *)&kappa_local,(int *)&delta_local,
               &prVar5->value,&args_3->value,pfVar4);
    for (var_2._4_4_ = 0.0; prVar6 = _selected_local, (int)var_2._4_4_ <= (int)kappa_local;
        var_2._4_4_ = (float)((int)var_2._4_4_ + 1)) {
      prVar5 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                             *)(this + 0x60),(long)(int)var_2._4_4_);
      prVar6 = prVar6 + prVar5->id;
      bit_array_impl::set((bit_array_impl *)it_local,prVar6->column);
      fVar7 = local_48;
      pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                         ((unique_ptr<float[],_std::default_delete<float[]>_> *)(this + 0x50),
                          (long)prVar6->value);
      *pfVar4 = fVar7 + *pfVar4;
      fVar7 = solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
              ::local_compute_reduced_cost<baryonyx::bit_array>
                        ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                          *)this,prVar6->column,(bit_array *)it_local);
      if (0.0 <= fVar7) {
        pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           ((unique_ptr<float[],_std::default_delete<float[]>_> *)(this + 0x50),
                            (long)prVar6->value);
        fVar7 = (*pfVar4 - fVar7) + local_48;
        pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           ((unique_ptr<float[],_std::default_delete<float[]>_> *)(this + 0x50),
                            (long)prVar6->value);
        *pfVar4 = fVar7;
      }
    }
    for (; prVar6 = _selected_local, var_2._4_4_ != delta_local;
        var_2._4_4_ = (float)((int)var_2._4_4_ + 1)) {
      prVar5 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                             *)(this + 0x60),(long)(int)var_2._4_4_);
      prVar6 = prVar6 + prVar5->id;
      bit_array_impl::unset((bit_array_impl *)it_local,prVar6->column);
      fVar7 = local_48;
      pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                         ((unique_ptr<float[],_std::default_delete<float[]>_> *)(this + 0x50),
                          (long)prVar6->value);
      *pfVar4 = *pfVar4 - fVar7;
      fVar7 = solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
              ::local_compute_reduced_cost<baryonyx::bit_array>
                        ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                          *)this,prVar6->column,(bit_array *)it_local);
      if (fVar7 <= 0.0) {
        pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           ((unique_ptr<float[],_std::default_delete<float[]>_> *)(this + 0x50),
                            (long)prVar6->value);
        fVar7 = (*pfVar4 + fVar7) - local_48;
        pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           ((unique_ptr<float[],_std::default_delete<float[]>_> *)(this + 0x50),
                            (long)prVar6->value);
        *pfVar4 = fVar7;
      }
    }
  }
  else {
    prVar5 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                           *)(this + 0x60),(long)(int)kappa_local);
    fVar7 = prVar5->value;
    pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       ((unique_ptr<float[],_std::default_delete<float[]>_> *)(this + 0x78),
                        (long)r_size_local);
    auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3fc00000),0),ZEXT416((uint)fVar7),
                             ZEXT416((uint)*pfVar4));
    *pfVar4 = auVar2._0_4_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_80,
               "    selected: {}/{} ({})/2 = pi {}\n");
    prVar5 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                           *)(this + 0x60),(long)(int)kappa_local);
    pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       ((unique_ptr<float[],_std::default_delete<float[]>_> *)(this + 0x78),
                        (long)r_size_local);
    debug_logger<false>::log<int,int,float,float>
              ((debug_logger<false> *)this,_auStack_80,(int *)&kappa_local,(int *)&delta_local,
               &prVar5->value,pfVar4);
    for (var_1._4_4_ = 0.0; prVar6 = _selected_local, var_1._4_4_ != delta_local;
        var_1._4_4_ = (float)((int)var_1._4_4_ + 1)) {
      prVar5 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                             *)(this + 0x60),(long)(int)var_1._4_4_);
      prStack_90 = prVar6 + prVar5->id;
      bit_array_impl::set((bit_array_impl *)it_local,prStack_90->column);
      fVar7 = local_48;
      pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                         ((unique_ptr<float[],_std::default_delete<float[]>_> *)(this + 0x50),
                          (long)prStack_90->value);
      *pfVar4 = fVar7 + *pfVar4;
      local_94 = solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                 ::local_compute_reduced_cost<baryonyx::bit_array>
                           ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                             *)this,prStack_90->column,(bit_array *)it_local);
      if (0.0 <= local_94) {
        pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           ((unique_ptr<float[],_std::default_delete<float[]>_> *)(this + 0x50),
                            (long)prStack_90->value);
        fVar7 = (*pfVar4 - local_94) + local_48;
        pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           ((unique_ptr<float[],_std::default_delete<float[]>_> *)(this + 0x50),
                            (long)prStack_90->value);
        *pfVar4 = fVar7;
      }
    }
  }
  bVar3 = is_valid_constraint<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array>
                    ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                      *)this,r_size_local,(bit_array *)it_local);
  fVar7 = local_44;
  if (bVar3) {
    pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       ((unique_ptr<float[],_std::default_delete<float[]>_> *)(this + 0x78),
                        (long)r_size_local);
    bVar3 = is_signbit_change<float>(fVar7,*pfVar4);
    return bVar3;
  }
  details::fail_fast("Precondition","is_valid_constraint(*this, k, x)",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-Z.cpp"
                     ,"436");
}

Assistant:

bool local_affect(Xtype& x,
                      Iterator it,
                      int k,
                      int selected,
                      int r_size,
                      const Float kappa,
                      const Float delta)
    {
        constexpr Float one{ 1 };
        constexpr Float two{ 2 };
        constexpr Float middle{ (two + one) / two };

        const auto old_pi = pi[k];

        auto d = (kappa / (one - kappa)) + delta;

        if (selected < 0) {
            pi[k] += R[0].value / two;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[0].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        } else if (selected + 1 >= r_size) {
            pi[k] += R[selected].value * middle;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }
        } else {
            pi[k] += ((R[selected].value + R[selected + 1].value) / two);

            logger::log("    selected: {}/{} ({}x{})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        R[selected + 1].value,
                        pi[k]);

            int i = 0;
            for (; i <= selected; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }

            for (; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        }

        // TODO job: develops is_valid_constraint for all the solvers
        bx_expects(is_valid_constraint(*this, k, x));

        return is_signbit_change(old_pi, pi[k]);
    }